

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O1

string * __thiscall
phosg::format_duration_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,uint64_t usecs,int8_t subsecond_precision)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  string seconds_str;
  string local_68;
  string local_48;
  
  uVar10 = usecs & 0xff;
  cVar4 = (char)usecs;
  if ((this < (phosg *)0xf4240) || (this < (phosg *)0x3938700)) {
    uVar8 = 6;
    if (-1 < cVar4) {
      uVar8 = uVar10;
    }
    string_printf_abi_cxx11_(__return_storage_ptr__,"%.*lf",(double)(long)this / 1000000.0,uVar8);
  }
  else {
    if ((ulong)this >> 10 < 0x35a4e9) {
      uVar8 = 3;
      if (-1 < cVar4) {
        uVar8 = uVar10;
      }
      auVar12._8_4_ = 0;
      auVar12._0_8_ = (ulong)this % 60000000;
      auVar12._12_4_ = 0x45300000;
      string_printf_abi_cxx11_
                (&local_68,"%.*lf",
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)((ulong)this % 60000000)) - 4503599627370496.0))
                 / 1000000.0,uVar8);
      if (local_68._M_string_length < 2) {
        ::std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      pcVar7 = "";
      if (local_68._M_dataplus._M_p[1] == '.') {
        pcVar7 = "0";
      }
      string_printf_abi_cxx11_(&local_48,"%lu:%s",(ulong)this / 60000000,pcVar7);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
    }
    else {
      uVar8 = 0;
      if ('\0' < cVar4) {
        uVar8 = uVar10;
      }
      if ((ulong)this >> 0xd < 0xa0eebb) {
        uVar10 = ((ulong)this / 60000000) % 0x3c;
        lVar6 = uVar10 * -60000000 + (ulong)this % 3600000000;
        auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar13._0_8_ = lVar6;
        auVar13._12_4_ = 0x45300000;
        string_printf_abi_cxx11_
                  (&local_68,"%.*lf",
                   ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000000.0,uVar8
                  );
        if (local_68._M_string_length == 1) {
          pcVar7 = "0";
        }
        else {
          if (local_68._M_string_length == 0) {
            ::std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1);
          }
          pcVar7 = "";
          if (local_68._M_dataplus._M_p[1] == '.') {
            pcVar7 = "0";
          }
        }
        string_printf_abi_cxx11_(&local_48,"%lu:%02lu:%s",(ulong)this / 3600000000,uVar10,pcVar7);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)this / 3600000000;
        lVar11 = (ulong)this / 3600000000 +
                 (ulong)(uint)(SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaab),8) << 3) * -3;
        uVar10 = ((ulong)this / 60000000) % 0x3c;
        lVar6 = uVar10 * -60000000 + lVar11 * -3600000000 + (ulong)this % 86400000000;
        auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar14._0_8_ = lVar6;
        auVar14._12_4_ = 0x45300000;
        string_printf_abi_cxx11_
                  (&local_68,"%.*lf",
                   ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000000.0,uVar8
                  );
        if (local_68._M_string_length == 1) {
          pcVar7 = "0";
        }
        else {
          if (local_68._M_string_length == 0) {
            ::std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1);
          }
          pcVar7 = "";
          if (local_68._M_dataplus._M_p[1] == '.') {
            pcVar7 = "0";
          }
        }
        string_printf_abi_cxx11_
                  (&local_48,"%lu:%02lu:%02lu:%s",(ulong)this / 86400000000,lVar11,uVar10,pcVar7);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    paVar9 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar9) {
      uVar3 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar9->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string format_duration(uint64_t usecs, int8_t subsecond_precision) {
  if (usecs < 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 6;
    }
    return string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs) / 1000000ULL);

  } else if (usecs < 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 6;
    }
    return string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs) / 1000000ULL);

  } else if (usecs < 60 * 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 3;
    }
    uint64_t minutes = usecs / (60 * 1000000ULL);
    uint64_t usecs_part = usecs - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%s", minutes,
               ((seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;

  } else if (usecs < 24 * 60 * 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 0;
    }
    uint64_t hours = usecs / (60 * 60 * 1000000ULL);
    uint64_t minutes = (usecs / (60 * 1000000ULL)) % 60;
    uint64_t usecs_part = usecs - (hours * 60 * 60 * 1000000ULL) - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%02" PRIu64 ":%s", hours, minutes,
               ((seconds_str.size() == 1 || seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;

  } else {
    if (subsecond_precision < 0) {
      subsecond_precision = 0;
    }
    uint64_t days = usecs / (24 * 60 * 60 * 1000000ULL);
    uint64_t hours = (usecs / (60 * 60 * 1000000ULL)) % 24;
    uint64_t minutes = (usecs / (60 * 1000000ULL)) % 60;
    uint64_t usecs_part = usecs - (days * 24 * 60 * 60 * 1000000ULL) - (hours * 60 * 60 * 1000000ULL) - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%02" PRIu64 ":%02" PRIu64 ":%s", days,
               hours, minutes, ((seconds_str.size() == 1 || seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;
  }
}